

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objcxx_eh.cc
# Opt level: O1

void test_cxx_eh_implementation(void)

{
  if ((_ZN12_GLOBAL__N_110done_setupE_0 & 1) != 0) {
    return;
  }
  eh_trampoline();
  __assert_fail("caught",
                "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/objcxx_eh.cc",
                0x135,"void test_cxx_eh_implementation()");
}

Assistant:

void test_cxx_eh_implementation()
{
	if (done_setup)
	{
		return;
	}
	bool caught = false;
	try
	{
		eh_trampoline();
	}
	catch(MagicValueHolder)
	{
		caught = true;
	}
	assert(caught);
}